

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestTailCallerImpl::foo(TestTailCallerImpl *this,FooContext context)

{
  CapTableReader *pCVar1;
  RequestHook *pRVar2;
  uint uVar3;
  long *in_RDX;
  Reader value;
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  tailRequest;
  Reader params;
  undefined1 local_f0 [16];
  CapTableReader *pCStack_e0;
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_d8;
  StructReader local_98;
  PointerBuilder local_68;
  int iStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_68);
  local_d8.super_Builder._builder.pointers = (WirePointer *)CONCAT44(uStack_4c,iStack_50);
  local_d8.super_Builder._builder.data = local_68.pointer;
  local_d8.super_Builder._builder.segment = local_68.segment;
  local_d8.super_Builder._builder.capTable = local_68.capTable;
  PointerReader::getStruct(&local_98,(PointerReader *)&local_d8,(word *)0x0);
  if (local_98.pointerCount == 0) {
    local_98.nestingLimit = 0x7fffffff;
    local_98.pointers = (WirePointer *)0x0;
    local_98.segment = (SegmentReader *)0x0;
    local_98.capTable = (CapTableReader *)0x0;
  }
  local_68.segment = (SegmentBuilder *)local_98.segment;
  local_68.capTable = (CapTableBuilder *)local_98.capTable;
  local_68.pointer = local_98.pointers;
  iStack_50 = local_98.nestingLimit;
  PointerReader::getCapability((PointerReader *)local_48);
  local_f0._8_8_ = local_48._0_8_;
  pCStack_e0 = (CapTableReader *)local_48._8_8_;
  local_f0._0_8_ = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCallee::Client::fooRequest
            (&local_d8,(Client *)local_f0,&local_38);
  pCVar1 = pCStack_e0;
  if (pCStack_e0 != (CapTableReader *)0x0) {
    pCStack_e0 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_f0._8_8_)->_vptr_Arena)
              (local_f0._8_8_,pCVar1->_vptr_CapTableReader[-2] + (long)&pCVar1->_vptr_CapTableReader
              );
  }
  uVar3 = 0;
  if (0x1f < local_98.dataSize) {
    uVar3 = *local_98.data;
  }
  ((WireValue<uint32_t>_conflict *)local_d8.super_Builder._builder.data)->value = uVar3;
  local_68.segment = local_d8.super_Builder._builder.segment;
  local_68.capTable = local_d8.super_Builder._builder.capTable;
  local_68.pointer = local_d8.super_Builder._builder.pointers;
  value.super_StringPtr.content.size_ = 0x14;
  value.super_StringPtr.content.ptr = "from TestTailCaller";
  PointerBuilder::setBlob<capnp::Text>(&local_68,value);
  (**(code **)(*in_RDX + 0x18))(this);
  pRVar2 = local_d8.hook.ptr;
  if (local_d8.hook.ptr != (RequestHook *)0x0) {
    local_d8.hook.ptr = (RequestHook *)0x0;
    (**(local_d8.hook.disposer)->_vptr_Disposer)
              (local_d8.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestTailCallerImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto tailRequest = params.getCallee().fooRequest();
  tailRequest.setI(params.getI());
  tailRequest.setT("from TestTailCaller");
  return context.tailCall(kj::mv(tailRequest));
}